

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int nni_msg_dup(nni_msg **dup,nni_msg *src)

{
  size_t __n;
  uint8_t *puVar1;
  uint8_t *puVar2;
  nni_msg *__dest;
  uint8_t *puVar3;
  int iVar4;
  
  __dest = (nni_msg *)nni_zalloc(0xf8);
  if (__dest == (nni_msg *)0x0) {
    iVar4 = 2;
  }
  else {
    memcpy(__dest,src,src->m_header_len);
    __dest->m_header_len = src->m_header_len;
    puVar3 = (uint8_t *)nni_zalloc((src->m_body).ch_cap);
    (__dest->m_body).ch_buf = puVar3;
    if (puVar3 == (uint8_t *)0x0) {
      iVar4 = 2;
    }
    else {
      (__dest->m_body).ch_cap = (src->m_body).ch_cap;
      __n = (src->m_body).ch_len;
      (__dest->m_body).ch_len = __n;
      puVar1 = (src->m_body).ch_ptr;
      puVar2 = (src->m_body).ch_buf;
      (__dest->m_body).ch_ptr = puVar3 + ((long)puVar1 - (long)puVar2);
      iVar4 = 0;
      if (__n != 0) {
        memcpy(puVar3 + ((long)puVar1 - (long)puVar2),(src->m_body).ch_ptr,__n);
        iVar4 = 0;
      }
    }
    if (puVar3 == (uint8_t *)0x0) {
      nni_free(__dest,0xf8);
    }
    else {
      __dest->m_pipe = src->m_pipe;
      nni_atomic_init(&__dest->m_refcnt);
      nni_atomic_set(&__dest->m_refcnt,1);
      *dup = __dest;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int
nni_msg_dup(nni_msg **dup, const nni_msg *src)
{
	nni_msg *m;
	int      rv;

	if ((m = NNI_ALLOC_STRUCT(m)) == NULL) {
		return (NNG_ENOMEM);
	}

	memcpy(m->m_header_buf, src->m_header_buf, src->m_header_len);
	m->m_header_len = src->m_header_len;

	if ((rv = nni_chunk_dup(&m->m_body, &src->m_body)) != 0) {
		NNI_FREE_STRUCT(m);
		return (rv);
	}

	m->m_pipe = src->m_pipe;
	nni_atomic_init(&m->m_refcnt);
	nni_atomic_set(&m->m_refcnt, 1);

	*dup = m;
	return (0);
}